

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
helics::ActionMessage::to_vector
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,ActionMessage *this)

{
  int iVar1;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = serializedByteCount(this);
  std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,(long)iVar1);
  toByteArray(this,(byte *)(__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)
                           ._M_impl.super__Vector_impl_data._M_start,(long)iVar1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> ActionMessage::to_vector() const
{
    std::vector<char> data;
    auto size = serializedByteCount();
    data.resize(size);
    toByteArray(reinterpret_cast<std::byte*>(data.data()), size);
    return data;
}